

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char **ppcVar1;
  curl_off_t cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  char in_AL;
  int iVar8;
  FormInfo *pFVar9;
  int *piVar10;
  char *pcVar11;
  FormInfo *pFVar12;
  long *plVar13;
  curl_slist *pcVar14;
  undefined8 *puVar15;
  char *pcVar16;
  size_t sVar17;
  curl_httppost *pcVar18;
  curl_httppost *pcVar19;
  uint uVar20;
  undefined8 in_RCX;
  size_t i;
  FormInfo *pFVar21;
  ulong uVar22;
  curl_httppost **ppcVar23;
  undefined8 in_RDX;
  size_t sVar24;
  undefined8 in_R8;
  undefined8 in_R9;
  FormInfo *ptr_1;
  int *piVar25;
  CURLFORMcode CVar26;
  FormInfo *ptr;
  curl_slist *pcVar27;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char *local_150;
  ulong local_148;
  char *local_140;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = &stack0x00000008;
  uVar20 = 0x10;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pFVar9 = (FormInfo *)(*Curl_ccalloc)(1,0x80);
  if (pFVar9 == (FormInfo *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar27 = (curl_slist *)0x0;
  piVar25 = (int *)0x0;
  CVar26 = CURL_FORMADD_OK;
  pFVar21 = pFVar9;
  bVar6 = false;
switchD_0013404d_caseD_9:
  pFVar12 = pFVar9;
  if (CVar26 == CURL_FORMADD_OK) {
    if ((bool)(piVar25 != (int *)0x0 & bVar6)) goto code_r0x00133fe1;
    uVar22 = (ulong)uVar20;
    if (uVar22 < 0x29) {
      uVar20 = uVar20 + 8;
      piVar10 = (int *)((long)local_e8 + uVar22);
    }
    else {
      piVar10 = (int *)arg[0].overflow_arg_area;
      arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
    }
    iVar8 = *piVar10;
    if (iVar8 != 0x11) goto LAB_00134039;
    CVar26 = CURL_FORMADD_OK;
    pFVar21 = pFVar9;
    pcVar11 = (char *)0x0;
    pcVar19 = (curl_httppost *)0x0;
    goto LAB_0013482c;
  }
  for (; pFVar12 != (FormInfo *)0x0; pFVar12 = pFVar12->more) {
    if (pFVar12->name_alloc == true) {
      (*Curl_cfree)(pFVar12->name);
      pFVar12->name = (char *)0x0;
      pFVar12->name_alloc = false;
    }
    if (pFVar12->value_alloc == true) {
      (*Curl_cfree)(pFVar12->value);
      pFVar12->value = (char *)0x0;
      pFVar12->value_alloc = false;
    }
    if (pFVar12->contenttype_alloc == true) {
      (*Curl_cfree)(pFVar12->contenttype);
      pFVar12->contenttype = (char *)0x0;
      pFVar12->contenttype_alloc = false;
    }
    if (pFVar12->showfilename_alloc == true) {
      (*Curl_cfree)(pFVar12->showfilename);
      pFVar12->showfilename = (char *)0x0;
      pFVar12->showfilename_alloc = false;
    }
  }
  goto LAB_00134bce;
code_r0x00133fe1:
  iVar8 = *piVar25;
  pcVar27 = *(curl_slist **)(piVar25 + 2);
  piVar25 = piVar25 + 4;
  CVar26 = CURL_FORMADD_OK;
  bVar6 = false;
  if (iVar8 == 0x11) goto switchD_0013404d_caseD_9;
  bVar6 = true;
LAB_00134039:
  CVar26 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar14 = pcVar27;
  switch(iVar8) {
  case 2:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 4;
  case 1:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->name == (char *)0x0) {
      if (!bVar6) {
        uVar22 = (ulong)uVar20;
        if (uVar22 < 0x29) {
          uVar20 = uVar20 + 8;
          plVar13 = (long *)((long)local_e8 + uVar22);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      CVar26 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pFVar21->name = (char *)pcVar14;
        CVar26 = CURL_FORMADD_OK;
      }
    }
    goto switchD_0013404d_caseD_9;
  case 3:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->namelength == 0) {
      if (!bVar6) {
        uVar22 = (ulong)uVar20;
        if (uVar22 < 0x29) {
          uVar20 = uVar20 + 8;
          plVar13 = (long *)((long)local_e8 + uVar22);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar21->namelength = (size_t)pcVar14;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_0013404d_caseD_9;
  case 5:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 8;
  case 4:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->value != (char *)0x0) goto switchD_0013404d_caseD_9;
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_0013404d_caseD_9;
    break;
  case 7:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if ((pFVar21->flags & 10) != 0) goto switchD_0013404d_caseD_9;
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_0013404d_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar21->value = pcVar11;
    CVar26 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_0013404d_caseD_9;
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 2;
    goto LAB_00134767;
  case 8:
    CVar26 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar7 = !bVar6;
    bVar6 = true;
    if (bVar7) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      piVar25 = (int *)*puVar15;
      bVar6 = piVar25 != (int *)0x0;
      CVar26 = (uint)(piVar25 == (int *)0x0) * 3;
    }
  default:
    goto switchD_0013404d_caseD_9;
  case 10:
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar21->value != (char *)0x0) {
      CVar26 = CURL_FORMADD_OPTION_TWICE;
      if (((pFVar21->flags & 1) == 0) || (CVar26 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
      goto switchD_0013404d_caseD_9;
      pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
      CVar26 = CURL_FORMADD_MEMORY;
      if (pcVar11 == (char *)0x0) goto switchD_0013404d_caseD_9;
      pFVar12 = AddFormInfo(pcVar11,(char *)0x0,pFVar21);
      if (pFVar12 == (FormInfo *)0x0) goto LAB_00134773;
      pFVar12->value_alloc = true;
      goto LAB_0013452c;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_0013404d_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar21->value = pcVar11;
    CVar26 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_0013404d_caseD_9;
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 1;
LAB_00134767:
    pFVar21->value_alloc = true;
    CVar26 = CURL_FORMADD_OK;
    goto switchD_0013404d_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->showfilename == (char *)0x0) {
      pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
      pFVar21->showfilename = pcVar11;
      CVar26 = CURL_FORMADD_MEMORY;
      if (pcVar11 != (char *)0x0) {
        pFVar21->showfilename_alloc = true;
        CVar26 = CURL_FORMADD_OK;
      }
    }
    goto switchD_0013404d_caseD_9;
  case 0xc:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 0x30;
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->buffer != (char *)0x0) goto switchD_0013404d_caseD_9;
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_0013404d_caseD_9;
    pFVar21->buffer = (char *)pcVar14;
    break;
  case 0xd:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->bufferlength == 0) {
      if (!bVar6) {
        uVar22 = (ulong)uVar20;
        if (uVar22 < 0x29) {
          uVar20 = uVar20 + 8;
          plVar13 = (long *)((long)local_e8 + uVar22);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar21->bufferlength = (size_t)pcVar14;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_0013404d_caseD_9;
  case 0xe:
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar21->contenttype == (char *)0x0) {
      CVar26 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
        pFVar21->contenttype = pcVar11;
        CVar26 = CURL_FORMADD_MEMORY;
        if (pcVar11 != (char *)0x0) {
          pFVar21->contenttype_alloc = true;
          CVar26 = CURL_FORMADD_OK;
        }
      }
      goto switchD_0013404d_caseD_9;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (((pFVar21->flags & 1) == 0) || (CVar26 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
    goto switchD_0013404d_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    CVar26 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_0013404d_caseD_9;
    pFVar12 = AddFormInfo((char *)0x0,pcVar11,pFVar21);
    if (pFVar12 == (FormInfo *)0x0) {
LAB_00134773:
      (*Curl_cfree)(pcVar11);
      CVar26 = CURL_FORMADD_MEMORY;
      goto switchD_0013404d_caseD_9;
    }
    pFVar12->contenttype_alloc = true;
LAB_0013452c:
    CVar26 = CURL_FORMADD_OK;
    pFVar21 = pFVar12;
    goto switchD_0013404d_caseD_9;
  case 0xf:
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->contentheader == (curl_slist *)0x0) {
      pFVar21->contentheader = pcVar14;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_0013404d_caseD_9;
  case 0x13:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 0x40;
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->userp != (char *)0x0) goto switchD_0013404d_caseD_9;
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_0013404d_caseD_9;
    pFVar21->userp = (char *)pcVar14;
    break;
  case 0x14:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 0x80;
  case 6:
    if (!bVar6) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    pFVar21->contentslength = (curl_off_t)pcVar14;
    CVar26 = CURL_FORMADD_OK;
    goto switchD_0013404d_caseD_9;
  }
  pFVar21->value = (char *)pcVar14;
  CVar26 = CURL_FORMADD_OK;
  goto switchD_0013404d_caseD_9;
LAB_0013482c:
  if (pFVar21 != (FormInfo *)0x0) {
    local_140 = pFVar21->name;
    if (local_140 == (char *)0x0) {
      if (pcVar19 == (curl_httppost *)0x0) goto LAB_00134b38;
LAB_00134856:
      uVar22 = pFVar21->flags;
      if (((((pFVar21->contentslength != 0 & (byte)uVar22) != 0) ||
           (uVar20 = (uint)uVar22, (uVar20 & 9) == 9)) || ((~uVar20 & 10) == 0)) ||
         ((~uVar20 & 0x30) == 0 && pFVar21->buffer == (char *)0x0)) goto LAB_00134b38;
      if (((uVar22 & 0x11) != 0) && (pFVar21->contenttype == (char *)0x0)) {
        pcVar16 = Curl_mime_contenttype
                            (*(char **)((long)&pFVar21->value + (ulong)(uVar20 & 0x10) * 4));
        if (pcVar16 == (char *)0x0) {
          pcVar16 = pcVar11;
        }
        if (pcVar16 == (char *)0x0) {
          pcVar16 = "application/octet-stream";
        }
        pcVar16 = (*Curl_cstrdup)(pcVar16);
        pFVar21->contenttype = pcVar16;
        if (pcVar16 != (char *)0x0) {
          pFVar21->contenttype_alloc = true;
          local_140 = pFVar21->name;
          goto LAB_001348f3;
        }
LAB_00134b3e:
        CVar26 = CURL_FORMADD_MEMORY;
        goto LAB_00134bb7;
      }
LAB_001348f3:
      if ((local_140 != (char *)0x0) && (pFVar21->namelength != 0)) {
        sVar24 = 0;
        while (pFVar21->namelength != sVar24) {
          pcVar16 = local_140 + sVar24;
          sVar24 = sVar24 + 1;
          if (*pcVar16 == '\0') {
            CVar26 = CURL_FORMADD_NULL;
            goto LAB_00134bb7;
          }
        }
      }
      local_148 = pFVar21->flags;
      if (pFVar21 == pFVar9 && (local_148 & 4) == 0) {
        if (local_140 != (char *)0x0) {
          sVar24 = pFVar21->namelength;
          if (sVar24 == 0) {
            sVar17 = strlen(local_140);
            sVar24 = sVar17 + 1;
          }
          local_140 = (char *)Curl_memdup(local_140,sVar24);
          pFVar21->name = local_140;
          if (local_140 != (char *)0x0) {
            pFVar21->name_alloc = true;
            local_148 = pFVar21->flags;
            goto LAB_00134971;
          }
        }
        goto LAB_00134b3e;
      }
LAB_00134971:
      local_150 = pFVar21->value;
      if ((local_148 & 0x6b) == 0) {
        if (local_150 == (char *)0x0) {
          local_150 = (char *)0x0;
        }
        else {
          sVar24 = pFVar21->contentslength;
          if (sVar24 == 0) {
            sVar17 = strlen(local_150);
            sVar24 = sVar17 + 1;
          }
          local_150 = (char *)Curl_memdup(local_150,sVar24);
          pFVar21->value = local_150;
          if (local_150 == (char *)0x0) goto LAB_00134b3e;
          pFVar21->value_alloc = true;
          local_140 = pFVar21->name;
          local_148 = pFVar21->flags;
        }
      }
      sVar17 = pFVar21->namelength;
      cVar2 = pFVar21->contentslength;
      pcVar16 = pFVar21->buffer;
      sVar24 = pFVar21->bufferlength;
      pcVar3 = pFVar21->contenttype;
      pcVar27 = pFVar21->contentheader;
      pcVar4 = pFVar21->showfilename;
      pcVar5 = pFVar21->userp;
      pcVar18 = (curl_httppost *)(*Curl_ccalloc)(1,0x70);
      if (pcVar18 == (curl_httppost *)0x0) goto LAB_00134b3e;
      pcVar18->name = local_140;
      if (local_140 == (char *)0x0) {
        sVar17 = 0;
      }
      else if (sVar17 == 0) {
        sVar17 = strlen(local_140);
      }
      pcVar18->namelength = sVar17;
      pcVar18->contents = local_150;
      pcVar18->contentlen = cVar2;
      pcVar18->buffer = pcVar16;
      pcVar18->bufferlength = sVar24;
      pcVar18->contenttype = pcVar3;
      pcVar18->contentheader = pcVar27;
      pcVar18->showfilename = pcVar4;
      pcVar18->userp = pcVar5;
      pcVar18->flags = local_148 | 0x80;
      if (pcVar19 == (curl_httppost *)0x0) {
        pcVar19 = *last_post;
        if (*last_post == (curl_httppost *)0x0) {
          pcVar19 = (curl_httppost *)httppost;
        }
        pcVar19->next = pcVar18;
        ppcVar23 = last_post;
      }
      else {
        pcVar18->more = pcVar19->more;
        ppcVar23 = &pcVar19->more;
      }
      *ppcVar23 = pcVar18;
      ppcVar1 = &pFVar21->contenttype;
      pFVar21 = pFVar21->more;
      pcVar19 = pcVar18;
      if (*ppcVar1 != (char *)0x0) {
        pcVar11 = *ppcVar1;
      }
      goto LAB_0013482c;
    }
    if (pFVar21->value != (char *)0x0 || pcVar19 != (curl_httppost *)0x0) goto LAB_00134856;
LAB_00134b38:
    CVar26 = CURL_FORMADD_INCOMPLETE;
LAB_00134bb7:
    for (; pFVar21 != (FormInfo *)0x0; pFVar21 = pFVar21->more) {
      if (pFVar21->name_alloc == true) {
        (*Curl_cfree)(pFVar21->name);
        pFVar21->name = (char *)0x0;
        pFVar21->name_alloc = false;
      }
      if (pFVar21->value_alloc == true) {
        (*Curl_cfree)(pFVar21->value);
        pFVar21->value = (char *)0x0;
        pFVar21->value_alloc = false;
      }
      if (pFVar21->contenttype_alloc == true) {
        (*Curl_cfree)(pFVar21->contenttype);
        pFVar21->contenttype = (char *)0x0;
        pFVar21->contenttype_alloc = false;
      }
      if (pFVar21->showfilename_alloc == true) {
        (*Curl_cfree)(pFVar21->showfilename);
        pFVar21->showfilename = (char *)0x0;
        pFVar21->showfilename_alloc = false;
      }
    }
  }
LAB_00134bce:
  while (pFVar9 != (FormInfo *)0x0) {
    pFVar21 = pFVar9->more;
    (*Curl_cfree)(pFVar9);
    pFVar9 = pFVar21;
  }
  return CVar26;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}